

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix
          (IntrinsicGeometryInterface *this)

{
  Face e;
  Face e_00;
  bool bVar1;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  *begin;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *this_00;
  long in_RDI;
  size_t i;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triplets;
  SparseMatrix<double,_0,_int> *in_stack_fffffffffffffe98;
  SurfaceMesh *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  MeshData<geometrycentral::surface::Face,_double> *in_stack_fffffffffffffeb0;
  ParentMeshT *in_stack_fffffffffffffeb8;
  SparseMatrix<double,_0,_int> *in_stack_fffffffffffffec0;
  undefined1 local_40 [24];
  undefined1 *local_28;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffea0);
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffea0);
  ::std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::vector
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             0x2473a6);
  SurfaceMesh::faces(in_stack_fffffffffffffea0);
  local_28 = local_40;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffea0);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffea0);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffea0,
                       (RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffe98);
    if (!bVar1) break;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x247433);
    e.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffec0;
    e.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffeb8;
    MeshData<geometrycentral::surface::Face,_unsigned_long>::operator[]
              ((MeshData<geometrycentral::surface::Face,_unsigned_long> *)in_stack_fffffffffffffeb0,
               e);
    e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffec0;
    e_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffeb8;
    in_stack_fffffffffffffec0 =
         (SparseMatrix<double,_0,_int> *)
         MeshData<geometrycentral::surface::Face,_double>::operator[]
                   (in_stack_fffffffffffffeb0,e_00);
    ::std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<unsigned_long&,unsigned_long&,double&>
              ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *
               )in_stack_fffffffffffffec0,(unsigned_long *)in_stack_fffffffffffffeb8,
               (unsigned_long *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffea0)
    ;
  }
  begin = (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
           *)SurfaceMesh::nFaces(*(SurfaceMesh **)(in_RDI + 8));
  this_00 = (vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
            SurfaceMesh::nFaces(*(SurfaceMesh **)(in_RDI + 8));
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            (in_stack_fffffffffffffec0,(Index)begin,(Index)this_00);
  Eigen::SparseMatrix<double,_0,_int>::operator=
            ((SparseMatrix<double,_0,_int> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)in_stack_fffffffffffffea0);
  ::std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::begin
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             in_stack_fffffffffffffe98);
  ::std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::end
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             in_stack_fffffffffffffe98);
  Eigen::SparseMatrix<double,0,int>::
  setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
            (in_stack_fffffffffffffec0,begin,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)this_00);
  ::std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::~vector
            (this_00);
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix() {
  faceIndicesQ.ensureHave();
  faceAreasQ.ensureHave();

  std::vector<Eigen::Triplet<double>> triplets;
  for (Face f : mesh.faces()) {
    size_t i = faceIndices[f];
    triplets.emplace_back(i, i, faceAreas[f]);
  }

  faceGalerkinMassMatrix = Eigen::SparseMatrix<double>(mesh.nFaces(), mesh.nFaces());
  faceGalerkinMassMatrix.setFromTriplets(triplets.begin(), triplets.end());
}